

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleLightNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *pScene)

{
  aiLight *this_00;
  aiNode *paVar1;
  char *sz;
  aiNode *newNode;
  aiLight *light;
  aiScene *pScene_local;
  DDLNode *node_local;
  OpenGEXImporter *this_local;
  
  light = (aiLight *)pScene;
  pScene_local = (aiScene *)node;
  node_local = (DDLNode *)this;
  paVar1 = (aiNode *)operator_new(0x46c);
  aiLight::aiLight((aiLight *)paVar1);
  newNode = paVar1;
  std::vector<aiLight_*,_std::allocator<aiLight_*>_>::push_back
            (&this->m_lightCache,(value_type *)&newNode);
  this->m_currentLight = (aiLight *)newNode;
  paVar1 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar1);
  this->m_tokenType = 7;
  this->m_currentNode = paVar1;
  pushNode(this,paVar1,(aiScene *)light);
  handleNodes(this,(DDLNode *)pScene_local,(aiScene *)light);
  popNode(this);
  this_00 = this->m_currentLight;
  sz = aiString::C_Str((aiString *)paVar1);
  aiString::Set(&this_00->mName,sz);
  return;
}

Assistant:

void OpenGEXImporter::handleLightNode( ODDLParser::DDLNode *node, aiScene *pScene ) {
    aiLight *light( new aiLight );
    m_lightCache.push_back( light );
    m_currentLight = light;

    aiNode *newNode = new aiNode;
    m_tokenType = Grammar::LightNodeToken;
    m_currentNode = newNode;
    pushNode( newNode, pScene );

    handleNodes( node, pScene );

    popNode();

    m_currentLight->mName.Set( newNode->mName.C_Str() );
}